

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sink-inl.h
# Opt level: O0

bool __thiscall spdlog::sinks::sink::should_log(sink *this,level_enum msg_level)

{
  int in_ESI;
  long in_RDI;
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  return *(int *)(in_RDI + 8) <= in_ESI;
}

Assistant:

SPDLOG_INLINE bool spdlog::sinks::sink::should_log(spdlog::level::level_enum msg_level) const {
    return msg_level >= level_.load(std::memory_order_relaxed);
}